

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinModulo
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  double __x;
  double __y;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar1;
  LocationRange *pLVar2;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  Interpreter *in_RSI;
  allocator_type *in_RDI;
  Value VVar3;
  double b;
  double a;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_000001d0;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_000001d8;
  string *in_stack_000001e0;
  LocationRange *in_stack_000001e8;
  Interpreter *in_stack_000001f0;
  string *in_stack_fffffffffffffee8;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_ffffffffffffff00;
  allocator<char> *__s;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 this_00;
  allocator<char> local_39;
  string local_38 [32];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  Interpreter *local_10;
  
  __s = &local_39;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),(char *)__s,
             (allocator<char> *)in_RSI);
  uVar4._0_1_ = (_Alloc_hider)0x2;
  uVar4._1_3_ = 0;
  uVar5 = 2;
  pLVar2 = (LocationRange *)&stack0xffffffffffffff80;
  this_00 = (Interpreter *)0x2;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d7a77);
  __l._M_len._0_4_ = in_stack_ffffffffffffff30;
  __l._M_array = (iterator)__s;
  __l._M_len._4_4_ = in_stack_ffffffffffffff34;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_RSI,__l,in_RDI);
  validateBuiltinArgs(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                      in_stack_000001d0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_stack_ffffffffffffff00);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d7adb);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,0);
  __x = (pvVar1->v).d;
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,1);
  __y = (pvVar1->v).d;
  if ((__y == 0.0) && (!NAN(__y))) {
    pLVar2 = (LocationRange *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),(char *)__s,
               (allocator<char> *)in_RSI);
    makeError(local_10,pLVar2,in_stack_fffffffffffffee8);
    __cxa_throw(pLVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  fmod(__x,__y);
  VVar3 = makeNumberCheck((Interpreter *)this_00,pLVar2,(double)CONCAT44(uVar5,uVar4));
  *(ulong *)(in_RDI + 0x40) = CONCAT44(in_stack_ffffffffffffff34,VVar3.t);
  *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = VVar3.v;
  return (AST *)0x0;
}

Assistant:

const AST *builtinModulo(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "modulo", args, {Value::NUMBER, Value::NUMBER});
        double a = args[0].v.d;
        double b = args[1].v.d;
        if (b == 0)
            throw makeError(loc, "division by zero.");
        scratch = makeNumberCheck(loc, std::fmod(a, b));
        return nullptr;
    }